

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O1

string * __thiscall
ut11::utility::ParseToString<std::shared_ptr<int>>::operator()[abi_cxx11_
          (string *__return_storage_ptr__,void *this,shared_ptr<int> *value)

{
  size_type *psVar1;
  element_type *peVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  peVar2 = (value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2 == (element_type *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"nullptr","");
    goto LAB_002140b4;
  }
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"shared_ptr:","");
  piVar3 = (value->super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::ostream::operator<<(local_1a0,*piVar3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  uVar6 = 0xf;
  if (local_1d0 != local_1c0) {
    uVar6 = local_1c0[0];
  }
  if (uVar6 < (ulong)(local_1e8 + local_1c8)) {
    uVar6 = 0xf;
    if (local_1f0 != local_1e0) {
      uVar6 = local_1e0[0];
    }
    if (uVar6 < (ulong)(local_1e8 + local_1c8)) goto LAB_00214035;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_1d0);
  }
  else {
LAB_00214035:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar1) {
    uVar4 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar1;
  puVar5[1] = 0;
  *(undefined1 *)psVar1 = 0;
LAB_002140b4:
  if (peVar2 != (element_type *)0x0) {
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0);
    }
    if ((peVar2 != (element_type *)0x0) && (local_1d0 != local_1c0)) {
      operator_delete(local_1d0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string operator()(const std::shared_ptr<T>& value) const
			{
				return value ? std::string("shared_ptr:") + ParseToString<T>()(*value) : "nullptr";
			}